

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall
cmCTestP4::DescribeParser::DescribeParser(DescribeParser *this,cmCTestP4 *p4,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',false);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DescribeParser_00a0bc40;
  (this->RegexHeader).regmust = (char *)0x0;
  (this->RegexHeader).program = (char *)0x0;
  (this->RegexHeader).progsize = 0;
  memset(&this->RegexHeader,0,0x20a);
  (this->RegexDiff).regmust = (char *)0x0;
  (this->RegexDiff).program = (char *)0x0;
  (this->RegexDiff).progsize = 0;
  memset(&this->RegexDiff,0,0x20a);
  this->P4 = p4;
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Changes).
           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Changes).
           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  cmCTestVC::Revision::Revision(&this->Rev);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(this->P4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexHeader,"^Change ([0-9]+) by (.+)@(.+) on (.*)$");
  cmsys::RegularExpression::compile(&this->RegexDiff,"^\\.\\.\\. (.*)#[0-9]+ ([^ ]+)$");
  return;
}

Assistant:

DescribeParser(cmCTestP4* p4, const char* prefix)
    : LineParser('\n', false)
    , P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexHeader.compile("^Change ([0-9]+) by (.+)@(.+) on (.*)$");
    this->RegexDiff.compile(R"(^\.\.\. (.*)#[0-9]+ ([^ ]+)$)");
  }